

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

target_ulong_conflict mmu_probe_sparc(CPUSPARCState *env,target_ulong_conflict address,int mmulev)

{
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  MemTxResult local_38;
  uint32_t local_34;
  MemTxResult result;
  uint32_t pde;
  hwaddr pde_ptr;
  CPUState *cs;
  int mmulev_local;
  target_ulong_conflict address_local;
  CPUSPARCState *env_local;
  
  cs._0_4_ = mmulev;
  cs._4_4_ = address;
  _mmulev_local = env;
  pde_ptr = (hwaddr)env_cpu(env);
  _result = (ulong)(_mmulev_local->mmuregs[1] << 4) + (ulong)(_mmulev_local->mmuregs[2] << 2);
  local_34 = address_space_ldl_sparc
                       ((uc_struct_conflict8 *)((CPUState *)pde_ptr)->as->uc,
                        ((CPUState *)pde_ptr)->as,_result,(MemTxAttrs)(local_3c & 0xff800000 | 1),
                        &local_38);
  if (local_38 == 0) {
    if (((local_34 & 3) == 0) || ((local_34 & 3) != 1)) {
      env_local._4_4_ = 0;
    }
    else {
      env_local._4_4_ = local_34;
      if ((int)cs != 3) {
        _result = (ulong)((cs._4_4_ >> 0x16 & 0xfffffffc) + (local_34 & 0xfffffffc) * 0x10);
        local_34 = address_space_ldl_sparc
                             (*(uc_struct_conflict8 **)(*(long *)(pde_ptr + 0x118) + 0x30),
                              *(AddressSpace **)(pde_ptr + 0x118),_result,
                              (MemTxAttrs)(local_40 & 0xff800000 | 1),&local_38);
        if (local_38 == 0) {
          env_local._4_4_ = local_34;
          switch(local_34 & 3) {
          default:
            env_local._4_4_ = 0;
            break;
          case 1:
            if ((int)cs != 2) {
              _result = (ulong)(((cs._4_4_ & 0xfc0000) >> 0x10) + (local_34 & 0xfffffffc) * 0x10);
              local_34 = address_space_ldl_sparc
                                   (*(uc_struct_conflict8 **)(*(long *)(pde_ptr + 0x118) + 0x30),
                                    *(AddressSpace **)(pde_ptr + 0x118),_result,
                                    (MemTxAttrs)(local_44 & 0xff800000 | 1),&local_38);
              if (local_38 == 0) {
                env_local._4_4_ = local_34;
                switch(local_34 & 3) {
                default:
                  env_local._4_4_ = 0;
                  break;
                case 1:
                  if ((int)cs != 1) {
                    _result = (ulong)(((cs._4_4_ & 0x3f000) >> 10) + (local_34 & 0xfffffffc) * 0x10)
                    ;
                    env_local._4_4_ =
                         address_space_ldl_sparc
                                   (*(uc_struct_conflict8 **)(*(long *)(pde_ptr + 0x118) + 0x30),
                                    *(AddressSpace **)(pde_ptr + 0x118),_result,
                                    (MemTxAttrs)(local_48 & 0xff800000 | 1),&local_38);
                    if (local_38 == 0) {
                      if (((env_local._4_4_ & 3) < 2) || ((env_local._4_4_ & 3) != 2)) {
                        env_local._4_4_ = 0;
                      }
                    }
                    else {
                      env_local._4_4_ = 0;
                    }
                  }
                  break;
                case 2:
                }
              }
              else {
                env_local._4_4_ = 0;
              }
            }
            break;
          case 2:
          }
        }
        else {
          env_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

target_ulong mmu_probe(CPUSPARCState *env, target_ulong address, int mmulev)
{
    CPUState *cs = env_cpu(env);
    hwaddr pde_ptr;
    uint32_t pde;
    MemTxResult result;

    /*
     * TODO: MMU probe operations are supposed to set the fault
     * status registers, but we don't do this.
     */

    /* Context base + context number */
    pde_ptr = (hwaddr)(env->mmuregs[1] << 4) +
        (env->mmuregs[2] << 2);
    pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr, MEMTXATTRS_UNSPECIFIED, &result);
    if (result != MEMTX_OK) {
        return 0;
    }

    switch (pde & PTE_ENTRYTYPE_MASK) {
    default:
    case 0: /* Invalid */
    case 2: /* PTE, maybe should not happen? */
    case 3: /* Reserved */
        return 0;
    case 1: /* L1 PDE */
        if (mmulev == 3) {
            return pde;
        }
        pde_ptr = ((address >> 22) & ~3) + ((pde & ~3) << 4);
        pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                MEMTXATTRS_UNSPECIFIED, &result);
        if (result != MEMTX_OK) {
            return 0;
        }

        switch (pde & PTE_ENTRYTYPE_MASK) {
        default:
        case 0: /* Invalid */
        case 3: /* Reserved */
            return 0;
        case 2: /* L1 PTE */
            return pde;
        case 1: /* L2 PDE */
            if (mmulev == 2) {
                return pde;
            }
            pde_ptr = ((address & 0xfc0000) >> 16) + ((pde & ~3) << 4);
            pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            if (result != MEMTX_OK) {
                return 0;
            }

            switch (pde & PTE_ENTRYTYPE_MASK) {
            default:
            case 0: /* Invalid */
            case 3: /* Reserved */
                return 0;
            case 2: /* L2 PTE */
                return pde;
            case 1: /* L3 PDE */
                if (mmulev == 1) {
                    return pde;
                }
                pde_ptr = ((address & 0x3f000) >> 10) + ((pde & ~3) << 4);
                pde = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, pde_ptr,
                                        MEMTXATTRS_UNSPECIFIED, &result);
                if (result != MEMTX_OK) {
                    return 0;
                }

                switch (pde & PTE_ENTRYTYPE_MASK) {
                default:
                case 0: /* Invalid */
                case 1: /* PDE, should not happen */
                case 3: /* Reserved */
                    return 0;
                case 2: /* L3 PTE */
                    return pde;
                }
            }
        }
    }
    return 0;
}